

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3InvalidFunction(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  void *pvVar1;
  char *z;
  char *zErr;
  char *zName;
  sqlite3_value **NotUsed2_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  pvVar1 = sqlite3_user_data(context);
  z = sqlite3_mprintf("unable to use function %s in the requested context",pvVar1);
  sqlite3_result_error(context,z,-1);
  sqlite3_free(z);
  return;
}

Assistant:

static void sqlite3InvalidFunction(
  sqlite3_context *context,  /* The function calling context */
  int NotUsed,               /* Number of arguments to the function */
  sqlite3_value **NotUsed2   /* Value of each argument */
){
  const char *zName = (const char*)sqlite3_user_data(context);
  char *zErr;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  zErr = sqlite3_mprintf(
      "unable to use function %s in the requested context", zName);
  sqlite3_result_error(context, zErr, -1);
  sqlite3_free(zErr);
}